

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::BuildPresetsHelper
          (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
           *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_R8;
  Object<cmCMakePresetsGraph::BuildPreset> local_40;
  Value *local_18;
  Value *value_local;
  vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
  *out_local;
  
  local_18 = value;
  value_local = (Value *)out;
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::BuildPreset>::Object
                (&local_40,
                 (Object<cmCMakePresetsGraph::BuildPreset> *)
                 (anonymous_namespace)::BuildPresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_40,in_R8);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::BuildPreset>::~Object(&local_40);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*)>
                   ::~function,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*)>
          ::operator()(&BuildPresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                        *)value_local,local_18);
  return RVar2;
}

Assistant:

ReadFileResult BuildPresetsHelper(std::vector<BuildPreset>& out,
                                  const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
    BuildPresetHelper);

  return helper(out, value);
}